

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_fixed.cc
# Opt level: O2

bool absl::time_internal::cctz::FixedOffsetFromName(string *name,seconds *offset)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  bVar3 = std::operator==(name,"UTC");
  if ((bVar3) || (bVar3 = std::operator==(name,"UTC0"), bVar3)) {
    lVar7 = 0;
LAB_0014cb93:
    offset->__r = lVar7;
    return true;
  }
  if ((name->_M_string_length == 0x12) &&
     (bVar3 = std::__equal<true>::equal<char>("Fixed/UTC","",(name->_M_dataplus)._M_p), bVar3)) {
    pcVar2 = (name->_M_dataplus)._M_p;
    cVar1 = pcVar2[9];
    if (((cVar1 == '-') || (cVar1 == '+')) &&
       ((((pcVar2[0xc] == ':' && (pcVar2[0xf] == ':')) &&
         (iVar4 = anon_unknown_0::Parse02d(pcVar2 + 10), iVar4 != -1)) &&
        (((iVar5 = anon_unknown_0::Parse02d(pcVar2 + 0xd), iVar5 != -1 &&
          (iVar6 = anon_unknown_0::Parse02d(pcVar2 + 0x10), iVar6 != -1)) &&
         (iVar6 = iVar6 + (iVar5 + iVar4 * 0x3c) * 0x3c, iVar6 < 0x15181)))))) {
      iVar4 = -iVar6;
      if (cVar1 != '-') {
        iVar4 = iVar6;
      }
      lVar7 = (long)iVar4;
      goto LAB_0014cb93;
    }
  }
  return false;
}

Assistant:

bool FixedOffsetFromName(const std::string& name, seconds* offset) {
  if (name == "UTC" || name == "UTC0") {
    *offset = seconds::zero();
    return true;
  }

  const std::size_t prefix_len = sizeof(kFixedZonePrefix) - 1;
  const char* const ep = kFixedZonePrefix + prefix_len;
  if (name.size() != prefix_len + 9)  // <prefix>+99:99:99
    return false;
  if (!std::equal(kFixedZonePrefix, ep, name.begin())) return false;
  const char* np = name.data() + prefix_len;
  if (np[0] != '+' && np[0] != '-') return false;
  if (np[3] != ':' || np[6] != ':')  // see note below about large offsets
    return false;

  int hours = Parse02d(np + 1);
  if (hours == -1) return false;
  int mins = Parse02d(np + 4);
  if (mins == -1) return false;
  int secs = Parse02d(np + 7);
  if (secs == -1) return false;

  secs += ((hours * 60) + mins) * 60;
  if (secs > 24 * 60 * 60) return false;  // outside supported offset range
  *offset = seconds(secs * (np[0] == '-' ? -1 : 1));  // "-" means west
  return true;
}